

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *
duckdb::BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(ART *art,Node *node)

{
  FixedSizeAllocator *this;
  IndexPointer IVar1;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *pBVar2;
  Node ptr;
  
  this = Node::GetAllocator(art,NODE_16);
  IVar1 = FixedSizeAllocator::New(this);
  ptr.super_IndexPointer.data = (IndexPointer)(IVar1.data & 0xffffffffffffff | 0x400000000000000);
  (node->super_IndexPointer).data = (idx_t)ptr;
  pBVar2 = Node::Ref<duckdb::BaseNode<(unsigned_char)16,(duckdb::NType)4>>(art,ptr,NODE_16);
  pBVar2->count = '\0';
  return pBVar2;
}

Assistant:

static BaseNode &New(ART &art, Node &node) {
		node = Node::GetAllocator(art, TYPE).New();
		node.SetMetadata(static_cast<uint8_t>(TYPE));

		auto &n = Node::Ref<BaseNode>(art, node, TYPE);
		n.count = 0;
		return n;
	}